

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::doit(aalcalc *this,string *subfolder)

{
  FILE *pFVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  FILE *pFVar5;
  undefined8 uVar6;
  reference pp_Var7;
  reference pp_Var8;
  __normal_iterator<_IO_FILE_**,_std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>_> local_11e8;
  __normal_iterator<_IO_FILE_**,_std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>_> local_11e0;
  iterator iter;
  sampleslevelRec sr;
  size_t i;
  summarySampleslevelHeader sh;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> vrec;
  FILE *pFStack_1198;
  int ret;
  FILE *summary_fin;
  int local_1188;
  int last_file_index;
  int last_period_no;
  int last_summary_id;
  longlong file_offset;
  int local_1170;
  int period_no;
  int file_index;
  int summary_id;
  uint local_1144;
  FILE *pFStack_1140;
  int lineno;
  FILE *in;
  allocator local_1111;
  string local_1110 [8];
  string s;
  char *pos;
  FILE *fin;
  string filename;
  undefined1 local_10c0 [8];
  vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> filehandles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filelist;
  char local_1088 [8];
  char line [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  string local_38 [8];
  string path;
  string *subfolder_local;
  aalcalc *this_local;
  
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"work/");
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_58,(ulong)local_38);
  bVar2 = std::operator!=(local_58,"/");
  std::__cxx11::string::~string((string *)local_58);
  if (bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (line + 0xff8),(char *)local_38);
    std::__cxx11::string::operator=(local_38,(string *)(line + 0xff8));
    std::__cxx11::string::~string((string *)(line + 0xff8));
  }
  loadoccurrence(this);
  summaryindex::doit((string *)local_38,&this->event_to_period_);
  initsamplesize(this,(string *)local_38);
  getmaxsummaryid(this,(string *)local_38);
  getsamplesizes(this);
  loadperiodtoweighting(this);
  loadensemblemapping(this);
  filelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->vec_sample_sum_loss_,(long)(this->samplesize_ + 1),
             (value_type_conflict1 *)
             &filelist.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>::resize
            (&this->vec_ensemble_aal_,(long)(this->max_summary_id_ * this->max_ensemble_id_ + 1));
  std::vector<aal_rec,_std::allocator<aal_rec>_>::resize
            (&this->vec_analytical_aal_,(long)(this->max_summary_id_ + 1));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::vector
            ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)local_10c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,
                 (char *)local_38);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pFVar5 = fopen(pcVar4,"rb");
  pFVar1 = _stderr;
  if (pFVar5 == (FILE *)0x0) {
    uVar6 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"FATAL:%s: cannot open %s\n","doit",uVar6);
    exit(1);
  }
  while (pcVar4 = fgets(local_1088,0x1000,pFVar5), pcVar4 != (char *)0x0) {
    pcVar4 = strchr(local_1088,10);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1110,local_1088,&local_1111);
    std::allocator<char>::~allocator((allocator<char> *)&local_1111);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::__cxx11::string::operator=((string *)&fin,(string *)&in);
    std::__cxx11::string::~string((string *)&in);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pFStack_1140 = fopen(pcVar4,"rb");
    pFVar1 = _stderr;
    if (pFStack_1140 == (FILE *)0x0) {
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"FATAL:%s: cannot open %s\n","doit",uVar6);
      exit(1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(value_type *)local_1110);
    std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::push_back
              ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)local_10c0,
               (value_type *)&stack0xffffffffffffeec0);
    std::__cxx11::string::~string(local_1110);
  }
  fclose(pFVar5);
  local_1144 = 1;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_index,
                 (char *)local_38);
  std::__cxx11::string::operator=((string *)&fin,(string *)&file_index);
  std::__cxx11::string::~string((string *)&file_index);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pFVar5 = fopen(pcVar4,"rb");
  pFVar1 = _stderr;
  if (pFVar5 == (FILE *)0x0) {
    uVar6 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"FATAL:%s: cannot open %s\n","doit",uVar6);
    exit(1);
  }
  last_file_index = -1;
  local_1188 = -1;
  summary_fin._4_4_ = -1;
  pFStack_1198 = (FILE *)0x0;
  while( true ) {
    pcVar4 = fgets(local_1088,0x1000,pFVar5);
    if (pcVar4 == (char *)0x0) {
      fclose(pFVar5);
      this->current_summary_id_ = last_file_index;
      if (last_file_index != -1) {
        do_calc_end(this,local_1188);
      }
      outputresultscsv_new(this);
      local_11e0._M_current =
           (_IO_FILE **)
           std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::begin
                     ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)local_10c0);
      while( true ) {
        local_11e8._M_current =
             (_IO_FILE **)
             std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::end
                       ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)local_10c0);
        bVar2 = __gnu_cxx::operator!=(&local_11e0,&local_11e8);
        if (!bVar2) break;
        pp_Var8 = __gnu_cxx::
                  __normal_iterator<_IO_FILE_**,_std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>_>
                  ::operator*(&local_11e0);
        fclose((FILE *)*pp_Var8);
        __gnu_cxx::
        __normal_iterator<_IO_FILE_**,_std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>_>::
        operator++(&local_11e0,0);
      }
      std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::clear
                ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)local_10c0);
      std::__cxx11::string::~string((string *)&fin);
      std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::~vector
                ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)local_10c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string(local_38);
      return;
    }
    uVar3 = __isoc99_sscanf(local_1088,"%d, %d, %d, %lld",&period_no,&local_1170,
                            (long)&file_offset + 4,&last_period_no);
    if (uVar3 != 4) break;
    if (last_file_index != period_no) {
      if (last_file_index != -1) {
        do_calc_end(this,local_1188);
      }
      local_1188 = -1;
      this->current_summary_id_ = period_no;
      last_file_index = period_no;
    }
    if (local_1188 != file_offset._4_4_) {
      if (local_1188 != -1) {
        do_calc_end(this,local_1188);
      }
      local_1188 = file_offset._4_4_;
    }
    if (summary_fin._4_4_ != local_1170) {
      summary_fin._4_4_ = local_1170;
      pp_Var7 = std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::operator[]
                          ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)local_10c0,
                           (long)local_1170);
      pFStack_1198 = (FILE *)*pp_Var7;
    }
    if (pFStack_1198 == (FILE *)0x0) {
      fprintf(_stderr,"FATAL:File handle is a nullptr");
      exit(1);
    }
    std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::vector
              ((vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id);
    fseek(pFStack_1198,_last_period_no,0);
    sr = (sampleslevelRec)fread((void *)((long)&i + 4),0xc,1,pFStack_1198);
    while (((sr != (sampleslevelRec)0x0 &&
            (sr = (sampleslevelRec)fread(&iter,8,1,pFStack_1198), sr != (sampleslevelRec)0x0)) &&
           ((int)iter._M_current != 0))) {
      if (((int)iter._M_current != -4) && ((int)iter._M_current != -5)) {
        std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::push_back
                  ((vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id,
                   (value_type *)&iter);
      }
    }
    do_calc_by_period(this,(summarySampleslevelHeader *)((long)&i + 4),
                      (vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id);
    std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::~vector
              ((vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id);
    local_1144 = local_1144 + 1;
  }
  fprintf(_stderr,"FATAL:Invalid data in line %d:\n%s %d",(ulong)local_1144,local_1088,(ulong)uVar3)
  ;
  exit(-1);
}

Assistant:

void aalcalc::doit(const std::string& subfolder)
{
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}
	loadoccurrence();
	summaryindex::doit(path, event_to_period_);
	initsamplesize(path);
	getmaxsummaryid(path);
	getsamplesizes();
	loadperiodtoweighting();
	loadensemblemapping();
	char line[4096];
	vec_sample_sum_loss_.resize(samplesize_+1, 0.0);
	vec_ensemble_aal_.resize(max_summary_id_ * max_ensemble_id_ + 1);
	vec_analytical_aal_.resize(max_summary_id_ + 1);
	std::vector<std::string> filelist;
	std::vector<FILE *> filehandles;
	std::string filename = path + "filelist.idx";
	FILE* fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}
	
	while (fgets(line, sizeof(line), fin) != 0) {
		char *pos;
		if ((pos = strchr(line, '\n')) != NULL) *pos = '\0';   // remove newline from buffer		
		std::string s = line;
		filename = path + s;
		FILE* in = fopen(filename.c_str(), "rb");
		if (in == NULL) {
			fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, s.c_str());
			exit(EXIT_FAILURE);
		}
		filelist.push_back(s);
		filehandles.push_back(in);
	}

	fclose(fin);

	int lineno = 1;
	filename = path + "summaries.idx";
	fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	int summary_id;
	int file_index;
	int period_no;
	long long file_offset;
	int last_summary_id = -1;
	int last_period_no = -1;
	int last_file_index = -1;
	FILE* summary_fin = nullptr;
	while (fgets(line, sizeof(line), fin) != 0)
	{
		int ret = sscanf(line, "%d, %d, %d, %lld", &summary_id,
				&file_index, &period_no, &file_offset);
		if (ret != 4) {
			fprintf(stderr, "FATAL:Invalid data in line %d:\n%s %d",
				lineno, line, ret);
			exit(-1);
		}
		else
		{
			if (last_summary_id != summary_id) {
				if (last_summary_id != -1) {
					do_calc_end(last_period_no);
				}
				last_period_no = -1;   // Reset
				current_summary_id_ = summary_id;
				last_summary_id = summary_id;
			}
			if (last_period_no != period_no) {
				if (last_period_no != -1) {
					do_calc_end(last_period_no);
				}
				last_period_no = period_no;
			}
			
			if (last_file_index != file_index) {
				last_file_index = file_index;
				summary_fin = filehandles[file_index];
			}
			if (summary_fin != nullptr) {
				std::vector<sampleslevelRec> vrec;
				flseek(summary_fin, file_offset, SEEK_SET);
				summarySampleslevelHeader sh;
				size_t i = fread(&sh, sizeof(sh), 1, summary_fin);
				while (i != 0) {
					sampleslevelRec sr;
					i = fread(&sr, sizeof(sr), 1, summary_fin);
					if (i == 0 || sr.sidx == 0) break;
					if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
					vrec.push_back(sr);
				}
				do_calc_by_period(sh, vrec);
			}else {
				fprintf(stderr, "FATAL:File handle is a nullptr");
				exit(EXIT_FAILURE);
			}

		}
		lineno++;
	}

	fclose(fin);
	current_summary_id_ = last_summary_id;
	if (last_summary_id != -1) do_calc_end(last_period_no);

	outputresultscsv_new();
	auto iter = filehandles.begin();
	while (iter != filehandles.end()) {
		fclose(*iter);
		iter++;
	}
	filehandles.clear();
}